

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall kratos::InterfaceVisitor::~InterfaceVisitor(InterfaceVisitor *this)

{
  InterfaceVisitor *this_local;
  
  ~InterfaceVisitor(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // local variables
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::InterfaceInstantiation) {
                visit(stmt->as<InterfaceInstantiationStmt>().get());
            }
        }
        // ports as well
        std::set<const InterfaceRef*> refs;
        for (auto const& port_name : generator->get_port_names()) {
            auto p = generator->get_port(port_name);
            if (p->is_interface()) {
                auto interface_p = p->as<InterfacePort>();
                const auto* ref = interface_p->interface();
                auto def = ref->definition();
                update_interface_definition(def, ref, generator);
            }
        }
    }